

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder__preinit(ma_decoder_read_proc onRead,ma_decoder_seek_proc onSeek,
                             ma_decoder_tell_proc onTell,void *pUserData,ma_decoder_config *pConfig,
                             ma_decoder *pDecoder)

{
  ma_result mVar1;
  ma_data_source_base *pDataSourceBase;
  
  if (pDecoder == (ma_decoder *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    memset(&(pDecoder->ds).rangeBegInFrames,0,0x220);
    (pDecoder->ds).vtable = &g_ma_decoder_data_source_vtable;
    (pDecoder->ds).rangeEndInFrames = 0xffffffffffffffff;
    (pDecoder->ds).loopEndInFrames = 0xffffffffffffffff;
    (pDecoder->ds).pCurrent = pDecoder;
    (pDecoder->ds).pNext = (ma_data_source *)0x0;
    (pDecoder->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    pDecoder->onRead = onRead;
    pDecoder->onSeek = onSeek;
    pDecoder->onTell = onTell;
    pDecoder->pUserData = pUserData;
    if (pConfig != (ma_decoder_config *)0x0) {
      mVar1 = ma_allocation_callbacks_init_copy
                        (&pDecoder->allocationCallbacks,&pConfig->allocationCallbacks);
      return mVar1;
    }
    (pDecoder->allocationCallbacks).onMalloc = ma__malloc_default;
    (pDecoder->allocationCallbacks).onRealloc = ma__realloc_default;
    (pDecoder->allocationCallbacks).onFree = ma__free_default;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

static ma_result ma_decoder__preinit(ma_decoder_read_proc onRead, ma_decoder_seek_proc onSeek, ma_decoder_tell_proc onTell, void* pUserData, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_data_source_config dataSourceConfig;

    MA_ASSERT(pConfig != NULL);

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pDecoder);

    dataSourceConfig = ma_data_source_config_init();
    dataSourceConfig.vtable = &g_ma_decoder_data_source_vtable;

    result = ma_data_source_init(&dataSourceConfig, &pDecoder->ds);
    if (result != MA_SUCCESS) {
        return result;
    }

    pDecoder->onRead    = onRead;
    pDecoder->onSeek    = onSeek;
    pDecoder->onTell    = onTell;
    pDecoder->pUserData = pUserData;

    result = ma_decoder__init_allocation_callbacks(pConfig, pDecoder);
    if (result != MA_SUCCESS) {
        ma_data_source_uninit(&pDecoder->ds);
        return result;
    }

    return MA_SUCCESS;
}